

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

int deqp::gles31::Functional::anon_unknown_1::referencePrimitiveCount
              (TessPrimitiveType primitiveType,SpacingMode spacingMode,bool usePointMode,
              float *innerLevels,float *outerLevels)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  int outer_2 [3];
  int iStack_5c;
  pointer local_58;
  int outer [3];
  int local_3c;
  int inner;
  int local_2c;
  
  bVar1 = true;
  if ((int)CONCAT71(in_register_00000011,usePointMode) == 0) {
    if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
      uVar4 = 3;
    }
    else if (primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
      uVar4 = 2;
    }
    else if (primitiveType == TESSPRIMITIVETYPE_QUADS) {
      uVar4 = 4;
    }
    else {
      uVar4 = 0xffffffff;
      bVar1 = false;
    }
    if (bVar1) {
      uVar5 = 1;
      if (1 < (int)uVar4) {
        uVar5 = (ulong)uVar4;
      }
      if (0.0 < *outerLevels) {
        uVar7 = 0;
        do {
          uVar8 = uVar5;
          if (uVar5 - 1 == uVar7) break;
          uVar8 = uVar7 + 1;
          lVar2 = uVar7 + 1;
          uVar7 = uVar8;
        } while (0.0 < outerLevels[lVar2]);
        bVar1 = (long)uVar8 < (long)(int)uVar4;
      }
    }
    if (!bVar1) {
      if (primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
        fVar9 = 1.0;
        if (1.0 <= *outerLevels) {
          fVar9 = *outerLevels;
        }
        fVar9 = ceilf(fVar9);
        iVar3 = getClampedRoundedTessLevel(spacingMode,outerLevels[1]);
        return iVar3 * (int)fVar9;
      }
      if (primitiveType != TESSPRIMITIVETYPE_QUADS) {
        if (primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
          return -1;
        }
        getClampedRoundedTriangleTessLevels(spacingMode,innerLevels,outerLevels,outer,outer_2);
        iVar3 = referenceTriangleNonPointModePrimitiveCount
                          (spacingMode,outer[0],outer_2[0],outer_2[1],outer_2[2]);
        return iVar3;
      }
      getClampedRoundedQuadTessLevels(spacingMode,innerLevels,outerLevels,outer,outer_2);
      iVar3 = referenceQuadNonPointModePrimitiveCount
                        (spacingMode,outer[0],outer[1],outer_2[0],outer_2[1],outer_2[2],iStack_5c);
      return iVar3;
    }
  }
  else {
    if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
      uVar4 = 3;
    }
    else if (primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
      uVar4 = 2;
    }
    else if (primitiveType == TESSPRIMITIVETYPE_QUADS) {
      uVar4 = 4;
    }
    else {
      uVar4 = 0xffffffff;
      bVar1 = false;
    }
    if (bVar1) {
      uVar5 = 1;
      if (1 < (int)uVar4) {
        uVar5 = (ulong)uVar4;
      }
      if (0.0 < *outerLevels) {
        uVar7 = 0;
        do {
          uVar8 = uVar5;
          if (uVar5 - 1 == uVar7) break;
          uVar8 = uVar7 + 1;
          lVar2 = uVar7 + 1;
          uVar7 = uVar8;
        } while (0.0 < outerLevels[lVar2]);
        bVar1 = (long)uVar8 < (long)(int)uVar4;
      }
    }
    if (!bVar1) {
      if (primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
        fVar9 = 1.0;
        if (1.0 <= *outerLevels) {
          fVar9 = *outerLevels;
        }
        fVar9 = ceilf(fVar9);
        iVar3 = getClampedRoundedTessLevel(spacingMode,outerLevels[1]);
        generateReferenceIsolineTessCoords
                  ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)outer_2
                   ,(int)fVar9,iVar3);
        pvVar6 = (void *)CONCAT44(outer_2[1],outer_2[0]);
      }
      else {
        if (primitiveType == TESSPRIMITIVETYPE_QUADS) {
          getClampedRoundedQuadTessLevels(spacingMode,innerLevels,outerLevels,&inner,outer);
          generateReferenceQuadTessCoords
                    ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                     outer_2,spacingMode,inner,local_2c,outer[0],outer[1],outer[2],local_3c);
        }
        else {
          if (primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
            return -1;
          }
          getClampedRoundedTriangleTessLevels(spacingMode,innerLevels,outerLevels,&inner,outer);
          generateReferenceTriangleTessCoords
                    ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                     outer_2,spacingMode,inner,outer[0],outer[1],outer[2]);
        }
        pvVar6 = (void *)CONCAT44(outer_2[1],outer_2[0]);
      }
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6,(long)local_58 - (long)pvVar6);
      }
      return (int)((ulong)(CONCAT44(iStack_5c,outer_2[2]) - (long)pvVar6) >> 2) * -0x55555555;
    }
  }
  return 0;
}

Assistant:

static int referencePrimitiveCount (TessPrimitiveType primitiveType, SpacingMode spacingMode, bool usePointMode, const float* innerLevels, const float* outerLevels)
{
	return usePointMode ? referencePointModePrimitiveCount		(primitiveType, spacingMode, innerLevels, outerLevels)
						: referenceNonPointModePrimitiveCount	(primitiveType, spacingMode, innerLevels, outerLevels);
}